

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall tonk::Connection::tonk_flush(Connection *this)

{
  strand *in_RDI;
  type *in_stack_ffffffffffffffd8;
  
  std::__atomic_base<int>::operator++((__atomic_base<int> *)(in_RDI + 3));
  std::unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>::
  operator->((unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_> *
             )0x143dfb);
  asio::io_context::strand::post<tonk::Connection::tonk_flush()::__0>
            (in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void Connection::tonk_flush()
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    TONK_DEBUG_ASSERT(SelfRefCount.DoesAppHoldReference());

    SelfRefCount.IncrementReferences();
    AsioEventStrand->post([this]()
    {
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
        Result flushResult = Outgoing.Flush();
        if (flushResult.IsFail()) {
            Logger.Error("tonk_flush failed: ", flushResult.ToJson());
            SelfRefCount.StartShutdown(Tonk_Error, flushResult);
        }

        SelfRefCount.DecrementReferences();
    });
}